

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cpp
# Opt level: O2

void __thiscall dynamicgraph::PoolStorage::writeGraph(PoolStorage *this,string *aFileName)

{
  long *plVar1;
  long lVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  string GenericName;
  string tmp1;
  time_t ltime;
  tm ltimeformatted;
  ofstream GraphFile;
  
  std::__cxx11::string::rfind((char *)aFileName,0x12cb85);
  std::__cxx11::string::substr((ulong)&tmp1,(ulong)aFileName);
  lVar2 = std::__cxx11::string::rfind((char *)aFileName,0x12cec2);
  GenericName._M_dataplus._M_p = (pointer)&GenericName.field_2;
  GenericName._M_string_length = 0;
  GenericName.field_2._M_local_buf[0] = '\0';
  if (lVar2 == -1) {
    std::__cxx11::string::_M_assign((string *)&GenericName);
  }
  else {
    std::__cxx11::string::substr((ulong)&GraphFile,(ulong)&tmp1);
    std::__cxx11::string::operator=((string *)&GenericName,(string *)&GraphFile);
    std::__cxx11::string::~string((string *)&GraphFile);
  }
  ltime = time((time_t *)0x0);
  localtime_r(&ltime,(tm *)&ltimeformatted);
  std::ofstream::ofstream(&GraphFile,(aFileName->_M_dataplus)._M_p,_S_out);
  poVar3 = std::operator<<((ostream *)&GraphFile,"/* This graph has been automatically generated. ")
  ;
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&GraphFile,"   ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,ltimeformatted.tm_year + 0x76c);
  poVar3 = std::operator<<(poVar3," Month: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,ltimeformatted.tm_mon + 1);
  poVar3 = std::operator<<(poVar3," Day: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,ltimeformatted.tm_mday);
  poVar3 = std::operator<<(poVar3," Time: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,ltimeformatted.tm_hour);
  poVar3 = std::operator<<(poVar3,":");
  std::ostream::operator<<(poVar3,ltimeformatted.tm_min);
  poVar3 = std::operator<<((ostream *)&GraphFile," */");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&GraphFile,"digraph \"");
  poVar3 = std::operator<<(poVar3,(string *)&GenericName);
  std::operator<<(poVar3,"\" { ");
  poVar3 = std::operator<<((ostream *)&GraphFile,"\t graph [ label=\"");
  poVar3 = std::operator<<(poVar3,(string *)&GenericName);
  poVar3 = std::operator<<(poVar3,"\" bgcolor = white rankdir=LR ]");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,"\t node [ fontcolor = black, color = black,");
  poVar3 = std::operator<<(poVar3,"fillcolor = gold1, style=filled, shape=box ] ; ");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&GraphFile,"\tsubgraph cluster_Entities { ");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&GraphFile,"\t} ");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (p_Var4 = (this->entityMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->entityMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    plVar1 = *(long **)(p_Var4 + 2);
    poVar3 = std::operator<<((ostream *)&GraphFile,"\"");
    poVar3 = std::operator<<(poVar3,(string *)(plVar1 + 1));
    poVar3 = std::operator<<(poVar3,"\"");
    poVar3 = std::operator<<(poVar3," [ label = \"");
    poVar3 = std::operator<<(poVar3,(string *)(plVar1 + 1));
    poVar3 = std::operator<<(poVar3,"\" ,");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"   fontcolor = black, color = black, fillcolor=cyan,");
    poVar3 = std::operator<<(poVar3," style=filled, shape=box ]");
    std::endl<char,std::char_traits<char>>(poVar3);
    (**(code **)(*plVar1 + 0x20))(plVar1,(ostream *)&GraphFile);
  }
  poVar3 = std::operator<<((ostream *)&GraphFile,"}");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ofstream::close();
  std::ofstream::~ofstream(&GraphFile);
  std::__cxx11::string::~string((string *)&GenericName);
  std::__cxx11::string::~string((string *)&tmp1);
  return;
}

Assistant:

void PoolStorage::writeGraph(const std::string &aFileName) {
  size_t IdxPointFound = aFileName.rfind(".");
  std::string tmp1 = aFileName.substr(0, IdxPointFound);
  size_t IdxSeparatorFound = aFileName.rfind("/");
  std::string GenericName;
  if (IdxSeparatorFound != std::string::npos)
    GenericName = tmp1.substr(IdxSeparatorFound, tmp1.length());
  else
    GenericName = tmp1;

  /* Reading local time */
  time_t ltime;
  ltime = time(NULL);
  struct tm ltimeformatted;
#ifdef WIN32
  localtime_s(&ltimeformatted, &ltime);
#else
  localtime_r(&ltime, &ltimeformatted);
#endif /*WIN32*/

  /* Opening the file and writing the first comment. */
  std::ofstream GraphFile(aFileName.c_str(), std::ofstream::out);
  GraphFile << "/* This graph has been automatically generated. " << std::endl;
  GraphFile << "   " << 1900 + ltimeformatted.tm_year
            << " Month: " << 1 + ltimeformatted.tm_mon
            << " Day: " << ltimeformatted.tm_mday
            << " Time: " << ltimeformatted.tm_hour << ":"
            << ltimeformatted.tm_min;
  GraphFile << " */" << std::endl;
  GraphFile << "digraph \"" << GenericName << "\" { ";
  GraphFile << "\t graph [ label=\"" << GenericName
            << "\" bgcolor = white rankdir=LR ]" << std::endl
            << "\t node [ fontcolor = black, color = black,"
            << "fillcolor = gold1, style=filled, shape=box ] ; " << std::endl;
  GraphFile << "\tsubgraph cluster_Entities { " << std::endl;

  GraphFile << "\t} " << std::endl;

  for (Entities::iterator iter = entityMap.begin(); iter != entityMap.end();
       ++iter) {
    Entity *ent = iter->second;
    GraphFile << "\"" << ent->getName() << "\""
              << " [ label = \"" << ent->getName() << "\" ," << std::endl
              << "   fontcolor = black, color = black, fillcolor=cyan,"
              << " style=filled, shape=box ]" << std::endl;
    ent->writeGraph(GraphFile);
  }

  GraphFile << "}" << std::endl;

  GraphFile.close();
}